

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsComplex helicsInputGetComplexObject(HelicsInput inp,HelicsError *err)

{
  HelicsComplex HVar1;
  double dVar2;
  complex<double> cval;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffff90;
  HelicsInput in_stack_ffffffffffffff98;
  double *pdVar3;
  complex<double> local_38;
  InputObject *local_28;
  double local_10;
  double local_8;
  
  local_28 = anon_unknown.dwarf_5d1c2::verifyInput
                       (in_stack_ffffffffffffff98,(HelicsError *)in_stack_ffffffffffffff90);
  if (local_28 == (InputObject *)0x0) {
    local_10 = -1.785e+39;
    local_8 = -1.785e+39;
  }
  else {
    helics::Input::getValue<std::complex<double>>(in_stack_ffffffffffffff90);
    pdVar3 = &local_10;
    dVar2 = std::complex<double>::real_abi_cxx11_(&local_38);
    *pdVar3 = dVar2;
    local_8 = std::complex<double>::imag_abi_cxx11_(&local_38);
  }
  HVar1.imag = local_8;
  HVar1.real = local_10;
  return HVar1;
}

Assistant:

HelicsComplex helicsInputGetComplexObject(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);

    if (inpObj == nullptr) {
        // time invalid is just an invalid double
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }

    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        return {cval.real(), cval.imag()};
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }
    // LCOV_EXCL_STOP
}